

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig::Serialize
          (HeapprofdConfig_ContinuousDumpConfig *this,Message *msg)

{
  bool bVar1;
  void *data;
  size_t size;
  Message *msg_local;
  HeapprofdConfig_ContinuousDumpConfig *this_local;
  
  bVar1 = std::bitset<7UL>::operator[](&this->_has_field_,5);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,5,this->dump_phase_ms_);
  }
  bVar1 = std::bitset<7UL>::operator[](&this->_has_field_,6);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,6,this->dump_interval_ms_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void HeapprofdConfig_ContinuousDumpConfig::Serialize(::protozero::Message* msg) const {
  // Field 5: dump_phase_ms
  if (_has_field_[5]) {
    msg->AppendVarInt(5, dump_phase_ms_);
  }

  // Field 6: dump_interval_ms
  if (_has_field_[6]) {
    msg->AppendVarInt(6, dump_interval_ms_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}